

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

optional<QStringConverter::Encoding> QStringConverter::encodingForHtml(QByteArrayView data)

{
  _Optional_payload_base<QStringConverter::Encoding> _Var1;
  char16_t in_CX;
  size_t extraout_RDX;
  ulong uVar2;
  _Optional_payload_base<QStringConverter::Encoding> _Var3;
  long in_FS_OFFSET;
  QByteArrayView data_00;
  QAnyStringView name;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  data_00.m_size = data.m_data;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  data_00.m_data = (storage_type *)0x0;
  _Var1 = (_Optional_payload_base<QStringConverter::Encoding>)
          encodingForData((QStringConverter *)data.m_size,data_00,in_CX);
  if (((ulong)_Var1 >> 0x20 & 1) == 0) {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
    parseHtmlMetaForEncoding((QByteArray *)&local_38,data);
    if ((undefined1 *)local_38.size == (undefined1 *)0x0) {
      _Var3._M_payload = (_Storage<QStringConverter::Encoding,_true>)0x0;
      _Var3._M_engaged = true;
      _Var3._5_3_ = 0;
      _Var1._M_payload = (_Storage<QStringConverter::Encoding,_true>)0x0;
      _Var1._M_engaged = false;
      _Var1._5_3_ = 0;
      uVar2 = 0;
    }
    else {
      name.m_size = extraout_RDX;
      name.field_0.m_data = (void *)local_38.size;
      _Var1 = (_Optional_payload_base<QStringConverter::Encoding>)
              encodingForName((QStringConverter *)local_38.ptr,name);
      uVar2 = (ulong)_Var1 & 0xffffff0000000000;
      _Var3 = _Var1;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  }
  else {
    uVar2 = (ulong)_Var1 & 0xffffff0000000000;
    _Var3 = _Var1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (optional<QStringConverter::Encoding>)
           ((ulong)_Var1 & 0xffffffff | (ulong)_Var3 & 0xff00000000 | uVar2);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<QStringConverter::Encoding> QStringConverter::encodingForHtml(QByteArrayView data)
{
    // determine charset
    std::optional<QStringConverter::Encoding> encoding = encodingForData(data);
    if (encoding)
        // trust the initial BOM
        return encoding;

    QByteArray encodingTag = parseHtmlMetaForEncoding(data);
    if (!encodingTag.isEmpty())
        return encodingForName(encodingTag);

    return Utf8;
}